

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::PromiseClient::~PromiseClient(PromiseClient *this)

{
  RpcConnectionState *pRVar1;
  Maybe<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient_&> local_60;
  PromiseClient *local_58;
  RpcClient *c;
  RpcClient *_c1269;
  Import *import;
  Maybe<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient_&> local_38;
  Import *_import1268;
  uint *id;
  Maybe<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient_&> local_18;
  uint *_id1263;
  PromiseClient *this_local;
  
  _id1263 = (uint *)this;
  local_18.ptr = (RpcClient *)kj::_::readMaybe<unsigned_int>(&this->importId);
  if (local_18.ptr != (RpcClient *)0x0) {
    _import1268 = (Import *)local_18.ptr;
    pRVar1 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::operator->
                       (&(this->super_RpcClient).connectionState);
    anon_unknown_18::ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Import>
    ::find((ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Import> *)&import
           ,(int)pRVar1 + 0x7a8);
    local_38.ptr = (RpcClient *)
                   kj::_::readMaybe<capnp::_::RpcSystemBase::RpcConnectionState::Import>
                             ((Maybe<capnp::_::RpcSystemBase::RpcConnectionState::Import_&> *)
                              &import);
    if (((local_38.ptr != (RpcClient *)0x0) &&
        (_c1269 = local_38.ptr,
        c = kj::_::readMaybe<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient>
                      ((Maybe<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient_&> *)
                       &((local_38.ptr)->super_ClientHook).brand),
        (PromiseClient *)c != (PromiseClient *)0x0)) &&
       (local_58 = (PromiseClient *)c, (PromiseClient *)c == this)) {
      kj::Maybe<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient_&>::Maybe(&local_60);
      kj::Maybe<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient_&>::operator=
                ((Maybe<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient_&> *)
                 &(_c1269->super_ClientHook).brand,&local_60);
    }
  }
  kj::ForkedPromise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>::~ForkedPromise(&this->fork);
  kj::Maybe<unsigned_int>::~Maybe(&this->importId);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own(&this->cap);
  RpcClient::~RpcClient(&this->super_RpcClient);
  return;
}

Assistant:

~PromiseClient() noexcept(false) {
      KJ_IF_SOME(id, importId) {
        // This object is representing an import promise.  That means the import table may still
        // contain a pointer back to it.  Remove that pointer.  Note that we have to verify that
        // the import still exists and the pointer still points back to this object because this
        // object may actually outlive the import.
        KJ_IF_SOME(import, connectionState->imports.find(id)) {
          KJ_IF_SOME(c, import.appClient) {
            if (&c == this) {
              import.appClient = kj::none;
            }
          }
        }
      }
    }